

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selist.c
# Opt level: O0

_Bool selist_set_insert(selist **qlp,void *data,cmp_cb cmp)

{
  selist *qlp_00;
  _Bool _Var1;
  int iVar2;
  int local_34;
  int cmpi;
  int i;
  selist *ql;
  cmp_cb cmp_local;
  void *data_local;
  selist **qlp_local;
  
  if (*qlp != (selist *)0x0) {
    qlp_00 = *qlp;
    ql = (selist *)cmp;
    if (cmp == (cmp_cb)0x0) {
      ql = (selist *)cmp_voidptr;
    }
    if ((0 < qlp_00->num_elements) &&
       (iVar2 = (*(code *)ql)(qlp_00->elements[qlp_00->num_elements + -1],data), iVar2 < 0)) {
      if ((qlp_00->num_elements != 0xe) &&
         ((qlp_00->next == (selist *)0x0 ||
          (iVar2 = (*(code *)ql)(qlp_00->next->elements[0],data), 0 < iVar2)))) {
        iVar2 = qlp_00->num_elements;
        qlp_00->num_elements = iVar2 + 1;
        qlp_00->elements[iVar2] = data;
        return true;
      }
      _Var1 = selist_set_insert(&qlp_00->next,data,(cmp_cb)ql);
      return _Var1;
    }
    for (local_34 = 0; local_34 != qlp_00->num_elements; local_34 = local_34 + 1) {
      iVar2 = (*(code *)ql)(data,qlp_00->elements[local_34]);
      if (iVar2 < 0) {
        selist_insert(qlp,local_34,data);
        return true;
      }
      if (iVar2 == 0) {
        return false;
      }
    }
  }
  selist_push(qlp,data);
  return true;
}

Assistant:

bool selist_set_insert(struct selist **qlp, void *data, cmp_cb cmp)
{
    if (*qlp) {
        selist *ql = *qlp;
        if (cmp==NULL) cmp = cmp_voidptr;
        if (ql->num_elements > 0 && cmp(ql->elements[ql->num_elements - 1], data) < 0) {
            if (ql->num_elements == LIST_MAXSIZE || (ql->next
                && cmp(ql->next->elements[0], data) <= 0)) {
                return selist_set_insert(&ql->next, data, cmp);
            }
            else {
                ql->elements[ql->num_elements++] = data;
            }
            return true;
        }
        else {
            int i;
            /* TODO: OPT | binary search */
            for (i = 0; i != ql->num_elements; ++i) {
                int cmpi = cmp(data, ql->elements[i]);
                if (cmpi < 0) {
                    selist_insert(qlp, i, data);
                    return true;
                }
                if (cmpi == 0) {
                    return false;
                }
            }
        }
    }
    selist_push(qlp, data);
    return true;
}